

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# user.c
# Opt level: O3

int linux_evfilt_user_knote_delete(filter *filt,knote *kn)

{
  int iVar1;
  
  if (((kn->kev).flags & 8) == 0) {
    epoll_ctl(filt->kf_kqueue->epollfd,2,(kn->field_10).kn_timerfd,(epoll_event *)0x0);
  }
  iVar1 = close((kn->field_10).kn_timerfd);
  if (iVar1 < 0) {
    iVar1 = -1;
  }
  else {
    (kn->field_10).kn_timerfd = -1;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int
linux_evfilt_user_knote_delete(struct filter *filt, struct knote *kn)
{
    int rv = 0;

    if (KNOTE_ENABLED(kn))
        linux_evfilt_user_knote_disable(filt, kn);

    dbg_printf("event_fd=%i - closed", kn->kn_eventfd);
    if (close(kn->kn_eventfd) < 0) {
        dbg_perror("close(2)");
        return (-1);
    }
    kn->kn_eventfd = -1;

    return rv;
}